

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<float>::doExecute
          (VariableStatement<float> *this,EvalContext *ctx)

{
  Environment *this_00;
  Variable<float> *variable;
  Expr<float> *pEVar1;
  IVal *pIVar2;
  IVal local_38;
  
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
    pEVar1 = (this->m_value).super_ExprPBase<float>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_38,pEVar1,ctx);
    Environment::bind<float>(this_00,variable,&local_38);
  }
  else {
    pEVar1 = (this->m_value).super_ExprPBase<float>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_38,pEVar1,ctx);
    pIVar2 = Environment::lookup<float>
                       (ctx->env,(this->m_variable).
                                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                                 .m_ptr);
    pIVar2->m_hasNaN = local_38.m_hasNaN;
    *(undefined7 *)&pIVar2->field_0x1 = local_38._1_7_;
    pIVar2->m_lo = local_38.m_lo;
    pIVar2->m_hi = local_38.m_hi;
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}